

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.hpp
# Opt level: O2

basic_istream<wchar_t,_std::char_traits<wchar_t>_> *
trng::utility::operator>>
          (basic_istream<wchar_t,_std::char_traits<wchar_t>_> *in,
          io_range<unsigned_long_*> *IO_range)

{
  char *in_RAX;
  unsigned_long *puVar1;
  delim_str local_28;
  
  puVar1 = IO_range->first;
  local_28.str = in_RAX;
  while ((((byte)in[*(long *)(*(long *)in + -0x18) + 0x20] & 5) == 0 && (puVar1 != IO_range->last)))
  {
    std::wistream::_M_extract<unsigned_long>((ulong *)in);
    puVar1 = puVar1 + 1;
    if (puVar1 != IO_range->last) {
      local_28.str = IO_range->delim_str;
      operator>>(in,&local_28);
    }
  }
  return in;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(std::basic_istream<char_t, traits_t> &in,
                                                     const io_range<T> &IO_range) {
      T pos{IO_range.first};
      while (in and pos != IO_range.last) {
        in >> (*pos);
        ++pos;
        if (pos != IO_range.last)
          in >> delim(IO_range.delim_str);
      }
      return in;
    }